

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O3

Iterator *
leveldb::NewTwoLevelIterator
          (Iterator *index_iter,BlockFunction block_function,void *arg,ReadOptions *options)

{
  Snapshot *pSVar1;
  Iterator *this;
  
  this = (Iterator *)operator_new(0xb8);
  Iterator::Iterator(this);
  this->_vptr_Iterator = (_func_int **)&PTR__TwoLevelIterator_001165e0;
  this[1]._vptr_Iterator = (_func_int **)block_function;
  this[1].cleanup_head_.function = (CleanupFunction)arg;
  pSVar1 = options->snapshot;
  this[1].cleanup_head_.arg1 = *(void **)options;
  this[1].cleanup_head_.arg2 = pSVar1;
  this[1].cleanup_head_.next = (CleanupNode *)options->decompress_allocator;
  this[2]._vptr_Iterator = (_func_int **)0x0;
  this[2].cleanup_head_.function = (CleanupFunction)0x0;
  this[2].cleanup_head_.arg2 = "";
  this[2].cleanup_head_.next = (CleanupNode *)0x0;
  IteratorWrapper::Set((IteratorWrapper *)&this[2].cleanup_head_,index_iter);
  this[3].cleanup_head_.arg1 = "";
  this[3].cleanup_head_.arg2 = (void *)0x0;
  this[3]._vptr_Iterator = (_func_int **)0x0;
  *(undefined1 *)&this[3].cleanup_head_.function = 0;
  this[3].cleanup_head_.next = &this[4].cleanup_head_;
  this[4]._vptr_Iterator = (_func_int **)0x0;
  *(undefined1 *)&this[4].cleanup_head_.function = 0;
  return this;
}

Assistant:

Iterator* NewTwoLevelIterator(Iterator* index_iter,
                              BlockFunction block_function, void* arg,
                              const ReadOptions& options) {
  return new TwoLevelIterator(index_iter, block_function, arg, options);
}